

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,ScanStmt *node)

{
  Identifier *pIVar1;
  ostream *poVar2;
  
  std::operator<<((ostream *)&std::cout,"scan ");
  pIVar1 = (node->m_ident)._M_t.
           super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>._M_t.
           super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>.
           super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl;
  (**(code **)((long)(pIVar1->super_Expr).super_Stmt + 0x10))(pIVar1,this);
  poVar2 = std::operator<<((ostream *)&std::cout,";");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void PrettyPrinter::visit(AST::ScanStmt *node) {
    std::cout << "scan ";
    node->m_ident->accept(this);
    std::cout << ";" << std::endl;
}